

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
          (string *__return_storage_ptr__,DrawIndirectBase *this,GLboolean value)

{
  char *pcVar1;
  allocator<char> *__a;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((int)this == 1) {
    pcVar1 = "mapped_ == GL_TRUE";
    __a = &local_9;
  }
  else {
    pcVar1 = "mapped_ == GL_FALSE";
    __a = &local_a;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar1 + 0xb,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string BoolToString(GLboolean value)
	{
		if (value == GL_TRUE)
			return "GL_TRUE";

		return "GL_FALSE";
	}